

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# losertree.h
# Opt level: O3

void __thiscall loser_tree<unsigned_char_*>::update(loser_tree<unsigned_char_*> *this)

{
  uint uVar1;
  uchar *__s2;
  int iVar2;
  Stream *pSVar3;
  uint *puVar4;
  uint uVar5;
  uint pos;
  uint __tmp;
  uint uVar6;
  bool bVar7;
  
  puVar4 = this->_nodes;
  uVar6 = *puVar4;
  uVar5 = this->_stream_offset + uVar6;
  if (1 < uVar5) {
    do {
      pos = uVar5 >> 1;
      if (this->_streams[uVar6].n == 0) {
LAB_00235c5d:
        uVar1 = this->_nodes[pos];
        this->_nodes[pos] = uVar6;
        uVar6 = uVar1;
      }
      else {
        pSVar3 = node2stream(this,pos);
        if (pSVar3->n != 0) {
          pSVar3 = node2stream(this,pos);
          if (*pSVar3->stream == (uchar *)0x0) {
            __assert_fail("a != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_losertree.cpp"
                          ,0x23,"int cmp(const unsigned char *, const unsigned char *)");
          }
          __s2 = *this->_streams[uVar6].stream;
          if (__s2 == (uchar *)0x0) {
            __assert_fail("b != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_losertree.cpp"
                          ,0x24,"int cmp(const unsigned char *, const unsigned char *)");
          }
          iVar2 = strcmp((char *)*pSVar3->stream,(char *)__s2);
          if (iVar2 < 0) goto LAB_00235c5d;
        }
      }
      bVar7 = 3 < uVar5;
      uVar5 = pos;
    } while (bVar7);
    puVar4 = this->_nodes;
  }
  *puVar4 = uVar6;
  return;
}

Assistant:

void update()
	{
		//debug() << __PRETTY_FUNCTION__ << std::endl;
		unsigned new_min = _nodes[0];
		for (unsigned i=(_stream_offset+new_min) >> 1; i!=0; i >>= 1) {
			if (stream_empty(_streams[new_min]) or
			    (not stream_empty(node2stream(i)) and
			     cmp(*node2stream(i).stream,
			         *_streams[new_min].stream) < 0)) {
				std::swap(new_min, _nodes[i]);
			}
		}
		_nodes[0] = new_min;
	}